

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_ssse3.c
# Opt level: O0

uint32_t adler32_ssse3(uint32_t adler,uint8_t *buf,size_t len)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint32_t uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  ulong in_RDX;
  undefined1 (*in_RSI) [16];
  longlong lVar12;
  undefined8 in_RDI;
  longlong lVar13;
  undefined1 auVar14 [16];
  __m128i x;
  __m128i x_00;
  size_t i;
  size_t k;
  size_t align_offset;
  size_t rem;
  size_t max_iters;
  __m128i vsum2_0;
  __m128i vsum2;
  __m128i v_sad_sum2;
  __m128i vbuf_0;
  __m128i v_short_sum2_0;
  __m128i v_short_sum2;
  __m128i v_sad_sum1;
  __m128i vs2_0;
  __m128i vs2;
  __m128i vs1;
  __m128i vs3;
  __m128i vs1_0;
  __m128i vbuf;
  __m128i zero;
  __m128i dot3v;
  __m128i dot2v_0;
  __m128i dot2v;
  uint32_t sum2;
  ulong local_5e0;
  ulong local_5d0;
  ulong local_5c8;
  ulong local_5b0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  uint local_48c;
  ulong local_488;
  undefined1 (*local_480) [16];
  uint local_474;
  uint32_t local_470;
  
  local_48c = (uint)in_RDI >> 0x10;
  local_474 = (uint)in_RDI & 0xffff;
  if (in_RDX == 1) {
    local_470 = adler32_len_1(local_474,(uint8_t *)in_RSI,local_48c);
  }
  else if (in_RSI == (undefined1 (*) [16])0x0) {
    local_470 = 1;
  }
  else if (in_RDX < 0x10) {
    local_470 = adler32_len_16(local_474,(uint8_t *)in_RSI,in_RDX,local_48c);
  }
  else {
    lVar13 = CONCAT71((int7)((ulong)in_RDI >> 8),0xc);
    lVar12 = CONCAT71((int7)((ulong)in_RSI >> 8),0xd);
    local_5b0 = 0x15b0;
    lVar1 = -((ulong)in_RSI & 0xf);
    uVar10 = lVar1 + 0x10;
    local_5c8 = 0;
    local_488 = in_RDX;
    local_480 = in_RSI;
    if (((ulong)in_RSI & 0xf) != 0) {
      if (in_RDX < lVar1 + 0x20U) {
        local_4e8 = *(undefined8 *)*in_RSI;
        uStack_4e0 = *(undefined8 *)(*in_RSI + 8);
        local_488 = in_RDX - 0x10;
        local_480 = in_RSI + 1;
        goto LAB_0011b2bc;
      }
      local_480 = in_RSI;
      for (local_5d0 = 0; local_5d0 < uVar10; local_5d0 = local_5d0 + 1) {
        local_474 = (byte)(*local_480)[0] + local_474;
        local_48c = local_474 + local_48c;
        local_480 = (undefined1 (*) [16])(*local_480 + 1);
      }
      local_488 = in_RDX - uVar10;
      local_5b0 = 0x15b0 - uVar10;
    }
    while (0xf < local_488) {
      if (local_488 < local_5b0) {
        local_5e0 = local_488;
      }
      else {
        local_5e0 = local_5b0;
      }
      local_5c8 = local_5e0 - (local_5e0 & 0xf);
      local_488 = local_488 - local_5c8;
      while (0x1f < local_5c8) {
        auVar7 = *local_480;
        auVar14 = *local_480;
        pauVar11 = local_480 + 1;
        local_480 = local_480 + 2;
        local_5c8 = local_5c8 - 0x20;
        psadbw(auVar14,ZEXT816(0));
        psadbw(*pauVar11,ZEXT816(0));
        auVar5._8_8_ = 0x1112131415161718;
        auVar5._0_8_ = 0x191a1b1c1d1e1f20;
        auVar14 = pmaddubsw(auVar7,auVar5);
        auVar8._8_8_ = 0x1000100010001;
        auVar8._0_8_ = 0x1000100010001;
        pmaddwd(auVar14,auVar8);
        auVar14._8_8_ = 0x102030405060708;
        auVar14._0_8_ = 0x90a0b0c0d0e0f10;
        auVar14 = pmaddubsw(*pauVar11,auVar14);
        auVar7._8_8_ = 0x1000100010001;
        auVar7._0_8_ = 0x1000100010001;
        pmaddwd(auVar14,auVar7);
      }
      while (0xf < local_5c8) {
        local_4e8 = *(undefined8 *)*local_480;
        uStack_4e0 = *(undefined8 *)(*local_480 + 8);
        local_480 = local_480 + 1;
        local_5c8 = local_5c8 - 0x10;
LAB_0011b2bc:
        auVar2._8_8_ = uStack_4e0;
        auVar2._0_8_ = local_4e8;
        psadbw(auVar2,ZEXT816(0));
        auVar4._8_8_ = uStack_4e0;
        auVar4._0_8_ = local_4e8;
        auVar3._8_8_ = 0x102030405060708;
        auVar3._0_8_ = 0x90a0b0c0d0e0f10;
        auVar14 = pmaddubsw(auVar4,auVar3);
        auVar6._8_8_ = 0x1000100010001;
        auVar6._0_8_ = 0x1000100010001;
        pmaddwd(auVar14,auVar6);
      }
      x[1] = lVar12;
      x[0] = lVar13;
      uVar9 = partial_hsum(x);
      local_474 = uVar9 % 0xfff1;
      x_00[1] = lVar12;
      x_00[0] = lVar13;
      uVar9 = hsum(x_00);
      local_48c = uVar9 % 0xfff1;
      local_5b0 = 0x15b0;
    }
    local_470 = adler32_len_16(local_474,(uint8_t *)local_480,local_488,local_48c);
  }
  return local_470;
}

Assistant:

Z_INTERNAL uint32_t adler32_ssse3(uint32_t adler, const uint8_t *buf, size_t len) {
    uint32_t sum2;

     /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (UNLIKELY(len == 1))
        return adler32_len_1(adler, buf, sum2);

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (UNLIKELY(buf == NULL))
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (UNLIKELY(len < 16))
        return adler32_len_16(adler, buf, len, sum2);

    const __m128i dot2v = _mm_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17);
    const __m128i dot2v_0 = _mm_setr_epi8(16, 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m128i dot3v = _mm_set1_epi16(1);
    const __m128i zero = _mm_setzero_si128();

    __m128i vbuf, vs1_0, vs3, vs1, vs2, vs2_0, v_sad_sum1, v_short_sum2, v_short_sum2_0,
            vbuf_0, v_sad_sum2, vsum2, vsum2_0;

    /* If our buffer is unaligned (likely), make the determination whether
     * or not there's enough of a buffer to consume to make the scalar, aligning
     * additions worthwhile or if it's worth it to just eat the cost of an unaligned
     * load. This is a pretty simple test, just test if 16 - the remainder + len is
     * < 16 */
    size_t max_iters = NMAX;
    size_t rem = (uintptr_t)buf & 15;
    size_t align_offset = 16 - rem;
    size_t k = 0;
    if (rem) {
        if (len < 16 + align_offset) {
            /* Let's eat the cost of this one unaligned load so that
             * we don't completely skip over the vectorization. Doing
             * 16 bytes at a time unaligned is better than 16 + <= 15
             * sums */
            vbuf = _mm_loadu_si128((__m128i*)buf);
            len -= 16;
            buf += 16;
            vs1 = _mm_cvtsi32_si128(adler);
            vs2 = _mm_cvtsi32_si128(sum2);
            vs3 = _mm_setzero_si128();
            vs1_0 = vs1;
            goto unaligned_jmp;
        }

        for (size_t i = 0; i < align_offset; ++i) {
            adler += *(buf++);
            sum2 += adler;
        }

        /* lop off the max number of sums based on the scalar sums done
         * above */
        len -= align_offset;
        max_iters -= align_offset;
    }


    while (len >= 16) {
        vs1 = _mm_cvtsi32_si128(adler);
        vs2 = _mm_cvtsi32_si128(sum2);
        vs3 = _mm_setzero_si128();
        vs2_0 = _mm_setzero_si128();
        vs1_0 = vs1;

        k = (len < max_iters ? len : max_iters);
        k -= k % 16;
        len -= k;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            vbuf_0 = _mm_load_si128((__m128i*)(buf + 16));
            buf += 32;
            k -= 32;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_sad_sum2 = _mm_sad_epu8(vbuf_0, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);

            vs1 = _mm_add_epi32(v_sad_sum2, vs1);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            v_short_sum2_0 = _mm_maddubs_epi16(vbuf_0, dot2v_0);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vsum2_0 = _mm_madd_epi16(v_short_sum2_0, dot3v);
            vs2_0 = _mm_add_epi32(vsum2_0, vs2_0);
            vs1_0 = vs1;
        }

        vs2 = _mm_add_epi32(vs2_0, vs2);
        vs3 = _mm_slli_epi32(vs3, 5);
        vs2 = _mm_add_epi32(vs3, vs2);
        vs3 = _mm_setzero_si128();

        while (k >= 16) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            buf += 16;
            k -= 16;

unaligned_jmp:
            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v_0);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs1_0 = vs1;
        }

        vs3 = _mm_slli_epi32(vs3, 4);
        vs2 = _mm_add_epi32(vs2, vs3);

        /* We don't actually need to do a full horizontal sum, since psadbw is actually doing
         * a partial reduction sum implicitly and only summing to integers in vector positions
         * 0 and 2. This saves us some contention on the shuffle port(s) */
        adler = partial_hsum(vs1) % BASE;
        sum2 = hsum(vs2) % BASE;
        max_iters = NMAX;
    }

    /* Process tail (len < 16).  */
    return adler32_len_16(adler, buf, len, sum2);
}